

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O3

void printhex32(void *blob,int len)

{
  ulong uVar1;
  
  printf("{ ");
  if (3 < len) {
    uVar1 = 0;
    do {
      printf("0x%08x, ",(ulong)*(uint *)((long)blob + uVar1 * 4));
      uVar1 = uVar1 + 1;
    } while ((uint)len >> 2 != uVar1);
  }
  putchar(0x7d);
  return;
}

Assistant:

void printhex32 ( const void * blob, int len )
{
  assert((len & 3) == 0);

  uint32_t * d = (uint32_t*)blob;

  printf("{ ");

  for(int i = 0; i < len/4; i++)
  {
    printf("0x%08x, ",d[i]);
  }

  printf("}");
}